

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *
Catch::sortTests(vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                 *__return_storage_ptr__,IConfig *config,
                vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                *unsortedTestCases)

{
  bool bVar1;
  int iVar2;
  iterator __first;
  iterator __last;
  SimplePcg32 *rng_inst;
  size_type sVar3;
  TestCaseInfo *t;
  iterator __first_00;
  iterator __last_00;
  ReusableStringStream *pRVar4;
  SourceLineInfo local_108;
  ReusableStringStream local_f8;
  string local_e8;
  reference local_c8;
  pair<unsigned_long,_Catch::TestCaseHandle> *indexed;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
  *__range3_1;
  uint64_t local_90;
  reference local_88;
  TestCaseHandle *handle;
  const_iterator __end3;
  const_iterator __begin3;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *__range3;
  vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
  indexed_tests;
  HashTest h;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *unsortedTestCases_local;
  IConfig *config_local;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *sorted;
  
  iVar2 = (*config->_vptr_IConfig[0x10])();
  if (iVar2 == 0) {
    std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::vector
              (__return_storage_ptr__,unsortedTestCases);
  }
  else if (iVar2 == 1) {
    std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::vector
              (__return_storage_ptr__,unsortedTestCases);
    __first = std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::begin
                        (__return_storage_ptr__);
    __last = std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::end
                       (__return_storage_ptr__);
    std::
    sort<__gnu_cxx::__normal_iterator<Catch::TestCaseHandle*,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>>>
              ((__normal_iterator<Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
                )__first._M_current,
               (__normal_iterator<Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
                )__last._M_current);
  }
  else {
    if (iVar2 != 2) {
      ReusableStringStream::ReusableStringStream(&local_f8);
      SourceLineInfo::SourceLineInfo
                (&local_108,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/H-EAL[P]vfs/tests/catch_amalgamated.cpp"
                 ,0x149c);
      pRVar4 = ReusableStringStream::operator<<(&local_f8,&local_108);
      pRVar4 = ReusableStringStream::operator<<(pRVar4,(char (*) [26])": Internal Catch2 error: ");
      pRVar4 = ReusableStringStream::operator<<(pRVar4,(char (*) [26])"Unknown test order value!");
      ReusableStringStream::str_abi_cxx11_(&local_e8,pRVar4);
      throw_logic_error(&local_e8);
    }
    seedRng(config);
    rng_inst = rng();
    anon_unknown_23::HashTest::HashTest
              ((HashTest *)
               &indexed_tests.
                super__Vector_base<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,rng_inst);
    std::
    vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
    ::vector((vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
              *)&__range3);
    sVar3 = std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::size
                      (unsortedTestCases);
    std::
    vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
    ::reserve((vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
               *)&__range3,sVar3);
    __end3 = std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::begin
                       (unsortedTestCases);
    handle = (TestCaseHandle *)
             std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::end
                       (unsortedTestCases);
    while (bVar1 = __gnu_cxx::
                   operator==<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
                             (&__end3,(__normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
                                       *)&handle), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_88 = __gnu_cxx::
                 __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
                 ::operator*(&__end3);
      t = TestCaseHandle::getTestCaseInfo(local_88);
      local_90 = anon_unknown_23::HashTest::operator()
                           ((HashTest *)
                            &indexed_tests.
                             super__Vector_base<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,t);
      std::
      vector<std::pair<unsigned_long,Catch::TestCaseHandle>,std::allocator<std::pair<unsigned_long,Catch::TestCaseHandle>>>
      ::emplace_back<unsigned_long,Catch::TestCaseHandle_const&>
                ((vector<std::pair<unsigned_long,Catch::TestCaseHandle>,std::allocator<std::pair<unsigned_long,Catch::TestCaseHandle>>>
                  *)&__range3,&local_90,local_88);
      __gnu_cxx::
      __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
      ::operator++(&__end3);
    }
    __first_00 = std::
                 vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
                 ::begin((vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
                          *)&__range3);
    __last_00 = std::
                vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
                ::end((vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
                       *)&__range3);
    std::
    sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,Catch::TestCaseHandle>*,std::vector<std::pair<unsigned_long,Catch::TestCaseHandle>,std::allocator<std::pair<unsigned_long,Catch::TestCaseHandle>>>>>
              ((__normal_iterator<std::pair<unsigned_long,_Catch::TestCaseHandle>_*,_std::vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>_>
                )__first_00._M_current,
               (__normal_iterator<std::pair<unsigned_long,_Catch::TestCaseHandle>_*,_std::vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>_>
                )__last_00._M_current);
    std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::vector
              (__return_storage_ptr__);
    sVar3 = std::
            vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
            ::size((vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
                    *)&__range3);
    std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::reserve
              (__return_storage_ptr__,sVar3);
    __end3_1 = std::
               vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
               ::begin((vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
                        *)&__range3);
    indexed = (pair<unsigned_long,_Catch::TestCaseHandle> *)
              std::
              vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
              ::end((vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
                     *)&__range3);
    while (bVar1 = __gnu_cxx::
                   operator==<std::pair<unsigned_long,_Catch::TestCaseHandle>_*,_std::vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>_>
                             (&__end3_1,
                              (__normal_iterator<std::pair<unsigned_long,_Catch::TestCaseHandle>_*,_std::vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>_>
                               *)&indexed), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_c8 = __gnu_cxx::
                 __normal_iterator<std::pair<unsigned_long,_Catch::TestCaseHandle>_*,_std::vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>_>
                 ::operator*(&__end3_1);
      std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::push_back
                (__return_storage_ptr__,&local_c8->second);
      __gnu_cxx::
      __normal_iterator<std::pair<unsigned_long,_Catch::TestCaseHandle>_*,_std::vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>_>
      ::operator++(&__end3_1);
    }
    std::
    vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
    ::~vector((vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
               *)&__range3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TestCaseHandle> sortTests(IConfig const &config, std::vector<TestCaseHandle> const &unsortedTestCases) {
        switch (config.runOrder()) {
        case TestRunOrder::Declared:
            return unsortedTestCases;

        case TestRunOrder::LexicographicallySorted: {
            std::vector<TestCaseHandle> sorted = unsortedTestCases;
            std::sort(sorted.begin(), sorted.end());
            return sorted;
        }
        case TestRunOrder::Randomized: {
            seedRng(config);
            HashTest h(rng());
            std::vector<std::pair<uint64_t, TestCaseHandle>> indexed_tests;
            indexed_tests.reserve(unsortedTestCases.size());

            for (auto const &handle : unsortedTestCases) {
                indexed_tests.emplace_back(h(handle.getTestCaseInfo()), handle);
            }

            std::sort(indexed_tests.begin(), indexed_tests.end());

            std::vector<TestCaseHandle> randomized;
            randomized.reserve(indexed_tests.size());

            for (auto const &indexed : indexed_tests) {
                randomized.push_back(indexed.second);
            }

            return randomized;
        }
        }

        CATCH_INTERNAL_ERROR("Unknown test order value!");
    }